

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

int cmsys::anon_unknown_3::GetFieldFromFile<long_long>
              (char *fileName,char *fieldName,longlong *value)

{
  int iVar1;
  longlong values [1];
  char *fieldNames [2];
  longlong local_20;
  char *local_18;
  undefined8 local_10;
  
  local_10 = 0;
  local_20 = 0;
  local_18 = fieldName;
  iVar1 = GetFieldsFromFile<long_long>(fileName,&local_18,&local_20);
  if (iVar1 == 0) {
    *value = local_20;
  }
  return iVar1;
}

Assistant:

int GetFieldFromFile(
      const char *fileName,
      const char *fieldName,
      T &value)
{
  const char *fieldNames[2]={fieldName,NULL};
  T values[1]={T(0)};
  int ierr=GetFieldsFromFile(fileName,fieldNames,values);
  if (ierr)
    {
    return ierr;
    }
  value=values[0];
  return 0;
}